

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImGuiWindow **ppIVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  bool bVar6;
  short sVar7;
  float fVar8;
  uint uVar9;
  int iVar10;
  ImGuiWindow *pIVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  ImGuiWindow *pIVar14;
  ImGuiWindow *pIVar15;
  ImGuiContext *g;
  byte bVar16;
  float fVar17;
  char cVar18;
  long lVar19;
  char cVar20;
  int iVar21;
  ImGuiWindow *pIVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar13 = GImGui;
  fVar24 = (GImGui->Style).TouchExtraPadding.x;
  fVar25 = (GImGui->Style).TouchExtraPadding.y;
  if (fVar24 <= 4.0) {
    fVar24 = 4.0;
  }
  if (fVar25 <= 4.0) {
    fVar25 = 4.0;
  }
  IVar12.y = fVar25;
  IVar12.x = fVar24;
  GImGui->WindowsHoverPadding = IVar12;
  pIVar14 = pIVar13->MovingWindow;
  pIVar22 = (ImGuiWindow *)0x0;
  if ((pIVar14 != (ImGuiWindow *)0x0) && ((pIVar14->Flags & 0x200) == 0)) {
    pIVar22 = pIVar14;
  }
  fVar24 = (pIVar13->Style).TouchExtraPadding.x;
  bVar23 = (pIVar13->IO).ConfigWindowsResizeFromEdges;
  fVar25 = fVar24;
  if (bVar23 == true) {
    fVar25 = (pIVar13->WindowsHoverPadding).x;
  }
  fVar8 = (pIVar13->Style).TouchExtraPadding.y;
  fVar17 = fVar8;
  if (bVar23 != false) {
    fVar17 = (pIVar13->WindowsHoverPadding).y;
  }
  lVar19 = (long)(pIVar13->Windows).Size;
  if (lVar19 < 1) {
    pIVar15 = (ImGuiWindow *)0x0;
  }
  else {
    lVar19 = lVar19 + 1;
    pIVar15 = (ImGuiWindow *)0x0;
    do {
      pIVar11 = (pIVar13->Windows).Data[lVar19 + -2];
      bVar23 = false;
      if (((pIVar11->Active == true) && (pIVar11->Hidden == false)) &&
         (uVar9 = pIVar11->Flags, (uVar9 >> 9 & 1) == 0)) {
        fVar26 = fVar24;
        if ((uVar9 & 0x1000042) == 0) {
          fVar26 = fVar25;
        }
        fVar3 = (pIVar13->IO).MousePos.x;
        if ((pIVar11->OuterRectClipped).Min.x - fVar26 <= fVar3) {
          fVar27 = fVar8;
          if ((uVar9 & 0x1000042) == 0) {
            fVar27 = fVar17;
          }
          fVar4 = (pIVar13->IO).MousePos.y;
          if ((((pIVar11->OuterRectClipped).Min.y - fVar27 <= fVar4) &&
              (fVar3 < fVar26 + (pIVar11->OuterRectClipped).Max.x)) &&
             (fVar4 < fVar27 + (pIVar11->OuterRectClipped).Max.y)) {
            sVar7 = (pIVar11->HitTestHoleSize).x;
            if (sVar7 != 0) {
              fVar26 = (float)(int)(pIVar11->HitTestHoleOffset).x + (pIVar11->Pos).x;
              if (fVar26 <= fVar3) {
                fVar27 = (float)(int)(pIVar11->HitTestHoleOffset).y + (pIVar11->Pos).y;
                bVar23 = (fVar4 < (float)(int)(pIVar11->HitTestHoleSize).y + fVar27 &&
                         fVar3 < fVar26 + (float)(int)sVar7) && fVar27 <= fVar4;
              }
              else {
                bVar23 = false;
              }
              if (bVar23) {
                bVar23 = false;
                goto LAB_0013a3e3;
              }
            }
            if (pIVar22 == (ImGuiWindow *)0x0) {
              pIVar22 = pIVar11;
            }
            if (((pIVar15 == (ImGuiWindow *)0x0) &&
                (pIVar15 = pIVar11, pIVar14 != (ImGuiWindow *)0x0)) &&
               (pIVar11->RootWindow == pIVar14->RootWindow)) {
              pIVar15 = (ImGuiWindow *)0x0;
            }
            bVar23 = pIVar15 != (ImGuiWindow *)0x0 && pIVar22 != (ImGuiWindow *)0x0;
          }
        }
      }
LAB_0013a3e3:
    } while ((!bVar23) && (lVar19 = lVar19 + -1, 1 < lVar19));
  }
  pIVar13->HoveredWindow = pIVar22;
  pIVar13->HoveredWindowUnderMovingWindow = pIVar15;
  pIVar14 = GetTopMostPopupModal();
  bVar23 = false;
  if ((pIVar14 != (ImGuiWindow *)0x0) && (bVar23 = false, pIVar22 != (ImGuiWindow *)0x0)) {
    pIVar15 = pIVar22->RootWindow;
    if (pIVar15->RootWindow == pIVar14) {
      bVar23 = false;
    }
    else if (pIVar15 == (ImGuiWindow *)0x0) {
      bVar23 = true;
    }
    else {
      do {
        bVar23 = pIVar15 == pIVar14;
        if (bVar23) goto LAB_0013a448;
        pIVar15 = pIVar15->ParentWindowInBeginStack;
      } while (pIVar15 != (ImGuiWindow *)0x0);
      bVar23 = false;
LAB_0013a448:
      bVar23 = (bool)(bVar23 ^ 1);
    }
  }
  ppIVar1 = &pIVar13->HoveredWindow;
  uVar9 = (pIVar13->IO).ConfigFlags;
  iVar10 = (pIVar13->OpenPopupStack).Size;
  iVar21 = -1;
  lVar19 = 0;
  bVar16 = 0;
  do {
    if ((pIVar13->IO).MouseClicked[lVar19] == true) {
      (pIVar13->IO).MouseDownOwned[lVar19] = pIVar22 != (ImGuiWindow *)0x0 || 0 < iVar10;
      (pIVar13->IO).MouseDownOwnedUnlessPopupClose[lVar19] =
           pIVar22 != (ImGuiWindow *)0x0 || pIVar14 != (ImGuiWindow *)0x0;
    }
    bVar6 = (pIVar13->IO).MouseDown[lVar19];
    if ((bVar6 == true) &&
       ((iVar21 == -1 ||
        (dVar5 = (pIVar13->IO).MouseClickedTime[iVar21],
        pdVar2 = (pIVar13->IO).MouseClickedTime + lVar19, *pdVar2 <= dVar5 && dVar5 != *pdVar2)))) {
      iVar21 = (int)lVar19;
    }
    bVar16 = bVar16 & 1 | bVar6;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  bVar6 = true;
  if ((uVar9 & 0x10) == 0) {
    bVar6 = bVar23;
  }
  cVar18 = '\x01';
  cVar20 = '\x01';
  if (iVar21 != -1) {
    cVar20 = (pIVar13->IO).MouseDownOwned[iVar21];
    cVar18 = (pIVar13->IO).MouseDownOwnedUnlessPopupClose[iVar21];
  }
  bVar23 = true;
  if ((pIVar13->DragDropActive == true) &&
     (bVar23 = true, (pIVar13->DragDropSourceFlags & 0x10) != 0)) {
    bVar23 = bVar6;
  }
  if (cVar20 != '\0') {
    bVar23 = bVar6;
  }
  if (bVar23) {
    *ppIVar1 = (ImGuiWindow *)0x0;
    pIVar13->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar13->WantCaptureMouseNextFrame == -1) {
    if ((cVar20 == '\0') || ((bVar23 = true, *ppIVar1 == (ImGuiWindow *)0x0 && (bVar16 == 0)))) {
      bVar23 = 0 < iVar10;
    }
    (pIVar13->IO).WantCaptureMouse = bVar23;
    if (cVar18 != '\0') {
      bVar23 = true;
      lVar19 = 0x35d0;
      if ((*ppIVar1 != (ImGuiWindow *)0x0) || (bVar16 != 0)) goto LAB_0013a5b3;
    }
    bVar23 = pIVar14 != (ImGuiWindow *)0x0;
    lVar19 = 0x35d0;
  }
  else {
    bVar23 = pIVar13->WantCaptureMouseNextFrame != 0;
    (pIVar13->IO).WantCaptureMouseUnlessPopupClose = bVar23;
    lVar19 = 0xd0;
  }
LAB_0013a5b3:
  (&pIVar13->Initialized)[lVar19] = bVar23;
  if (pIVar13->WantCaptureKeyboardNextFrame == -1) {
    bVar23 = pIVar13->ActiveId != 0 || pIVar14 != (ImGuiWindow *)0x0;
  }
  else {
    bVar23 = pIVar13->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar13->IO).WantCaptureKeyboard = bVar23;
  if (((uVar9 & 9) == 1 & (pIVar13->IO).NavActive) == 1) {
    (pIVar13->IO).WantCaptureKeyboard = true;
  }
  (pIVar13->IO).WantTextInput = pIVar13->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}